

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_pixelformat.cpp
# Opt level: O0

void __thiscall Prog::draw_sample(Prog *this)

{
  char *pcVar1;
  Label *this_00;
  long in_RDI;
  undefined8 in_XMM1_Qa;
  undefined8 uVar2;
  string s;
  int frames;
  char str [256];
  double t1;
  double t0;
  ALLEGRO_BITMAP *target;
  int bmp_h;
  int bmp_w;
  bool enable_timing;
  bool use_memory;
  ALLEGRO_BITMAP *bitmap2;
  ALLEGRO_BITMAP *bitmap1;
  int j;
  int i;
  string *in_stack_fffffffffffffd78;
  Label *in_stack_fffffffffffffd80;
  allocator<char> *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  string local_228 [39];
  allocator<char> local_201;
  string local_200 [36];
  undefined8 local_1dc;
  undefined8 local_1d4;
  undefined8 local_1cc;
  undefined4 local_1c4;
  string local_1b8 [55];
  allocator<char> local_181;
  string local_180 [36];
  int local_15c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158 [8];
  double local_58;
  double local_50;
  undefined8 local_48;
  undefined8 local_38;
  undefined4 local_2c;
  undefined4 local_28;
  byte local_22;
  byte local_21;
  long local_20;
  long local_18;
  int local_10;
  int local_c;
  
  local_c = List::get_cur_value((List *)(in_RDI + 0x128));
  local_10 = List::get_cur_value((List *)(in_RDI + 0x180));
  local_21 = Button::get_pushed((Button *)(in_RDI + 0x238));
  local_22 = Button::get_pushed((Button *)(in_RDI + 0x298));
  local_28 = 0x80;
  local_2c = 0x80;
  if ((local_21 & 1) == 0) {
    al_set_new_bitmap_flags(0x400);
  }
  else {
    al_set_new_bitmap_flags(1);
  }
  al_set_new_bitmap_format(formats[local_c].format);
  local_18 = al_load_bitmap(*(undefined8 *)(in_RDI + 0x358));
  if (local_18 == 0) {
    log_printf("Could not load image %s, bitmap format = %d\n",*(undefined8 *)(in_RDI + 0x358),
               (ulong)(uint)formats[local_c].format);
  }
  else {
    local_28 = al_get_bitmap_width(local_18);
    local_2c = al_get_bitmap_height(local_18);
  }
  al_set_new_bitmap_format(formats[local_10].format);
  local_20 = al_create_bitmap(local_28,local_2c);
  if (local_20 == 0) {
    log_printf("Could not create bitmap, format = %d\n",(ulong)(uint)formats[local_10].format);
  }
  if ((local_18 == 0) || (local_20 == 0)) {
    uVar2 = 0;
    local_1cc = al_map_rgb_f();
    local_1c4 = (undefined4)uVar2;
    al_draw_line(0,0,0x43a00000,0x43480000,local_1cc,uVar2);
    uVar2 = 0;
    local_1dc = al_map_rgb_f(0x3f800000);
    local_1d4 = uVar2;
    al_draw_line(0,0x43480000,0x43a00000,0,local_1dc,uVar2);
  }
  else {
    local_38 = al_get_target_bitmap();
    al_set_target_bitmap(local_20);
    local_48 = al_map_rgb(0x80,0x80);
    al_clear_to_color(local_48,in_XMM1_Qa);
    al_set_blender(0,1);
    if ((local_22 & 1) == 0) {
      al_draw_bitmap(0,local_18,0);
      in_stack_fffffffffffffdb0 = (allocator<char> *)&stack0xfffffffffffffe47;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      Label::set_text(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      std::__cxx11::string::~string(local_1b8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe47);
    }
    else {
      local_15c = 0;
      local_50 = (double)al_get_time();
      log_printf("Timing...\n");
      do {
        al_draw_bitmap(0,local_18,0);
        local_15c = local_15c + 1;
        local_58 = (double)al_get_time();
      } while (local_58 - local_50 < 0.25);
      log_printf("    ...done.\n");
      in_stack_fffffffffffffdc0 = local_158;
      sprintf((char *)in_stack_fffffffffffffdc0,"%.0f FPS",(double)local_15c / (local_58 - local_50)
             );
      in_stack_fffffffffffffdb8 = (char *)(in_RDI + 0x2f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      Label::set_text(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      std::__cxx11::string::~string(local_180);
      std::allocator<char>::~allocator(&local_181);
    }
    al_set_target_bitmap(local_38);
    al_set_blender(0,1,3);
    al_draw_bitmap(0,local_20,0);
  }
  get_format_name((ALLEGRO_BITMAP *)in_stack_fffffffffffffd78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::string::operator+=(local_200," -> ");
  pcVar1 = get_format_name((ALLEGRO_BITMAP *)in_stack_fffffffffffffd78);
  std::__cxx11::string::operator+=(local_200,pcVar1);
  this_00 = (Label *)(in_RDI + 0x1d8);
  std::__cxx11::string::string(local_228,local_200);
  Label::set_text(this_00,in_stack_fffffffffffffd78);
  std::__cxx11::string::~string(local_228);
  al_destroy_bitmap(local_18);
  al_destroy_bitmap(local_20);
  std::__cxx11::string::~string(local_200);
  return;
}

Assistant:

void Prog::draw_sample()
{
   const int i = source_list.get_cur_value();
   const int j = dest_list.get_cur_value();
   ALLEGRO_BITMAP *bitmap1;
   ALLEGRO_BITMAP *bitmap2;
   bool use_memory = use_memory_button.get_pushed();
   bool enable_timing = enable_timing_button.get_pushed();
   int bmp_w = 128;
   int bmp_h = 128;
   
   if (use_memory)
      al_set_new_bitmap_flags(ALLEGRO_MEMORY_BITMAP);
   else
      al_set_new_bitmap_flags(ALLEGRO_VIDEO_BITMAP);

   al_set_new_bitmap_format(formats[i].format);

   bitmap1 = al_load_bitmap(bmp_filename);
   if (!bitmap1) {
      log_printf("Could not load image %s, bitmap format = %d\n", bmp_filename,
         formats[i].format);
   }
   else {
      bmp_w = al_get_bitmap_width(bitmap1);
      bmp_h = al_get_bitmap_height(bitmap1);
   }

   al_set_new_bitmap_format(formats[j].format);

   bitmap2 = al_create_bitmap(bmp_w, bmp_h);
   if (!bitmap2) {
      log_printf("Could not create bitmap, format = %d\n", formats[j].format);
   }

   if (bitmap1 && bitmap2) {
      ALLEGRO_BITMAP *target = al_get_target_bitmap();

      al_set_target_bitmap(bitmap2);
      al_clear_to_color(al_map_rgb(128, 128, 128));
      al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_ZERO);
      if (enable_timing) {
         double t0, t1;
         char str[256];
         int frames = 0;

         t0 = al_get_time();
         log_printf("Timing...\n");
         do {
           al_draw_bitmap(bitmap1, 0, 0, 0);
           frames++;
           t1 = al_get_time();
         } while (t1 - t0 < 0.25);
         log_printf("    ...done.\n");
         sprintf(str, "%.0f FPS", (double)frames / (t1 - t0));
         time_label.set_text(str);
      }
      else {
         al_draw_bitmap(bitmap1, 0, 0, 0);
         time_label.set_text("");
      }

      al_set_target_bitmap(target);
      al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_INVERSE_ALPHA);
      al_draw_bitmap(bitmap2, 0, 0, 0);
   }
   else {
      al_draw_line(0, 0, 320, 200, al_map_rgb_f(1, 0, 0), 0);
      al_draw_line(0, 200, 320, 0, al_map_rgb_f(1, 0, 0), 0);
   }

   std::string s = get_format_name(bitmap1);
   s += " -> ";
   s += get_format_name(bitmap2);
   true_formats.set_text(s);

   al_destroy_bitmap(bitmap1);
   al_destroy_bitmap(bitmap2);
}